

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O1

string * __thiscall
cmTimestamp::CurrentTime
          (string *__return_storage_ptr__,cmTimestamp *this,string *formatString,bool utcFlag)

{
  pointer pcVar1;
  time_t timeT;
  time_t currentTimeT;
  string source_date_epoch;
  istringstream iss;
  string local_1f0;
  string local_1d0;
  long local_1b0 [4];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  timeT = time((time_t *)0x0);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  cmsys::SystemTools::GetEnv("SOURCE_DATE_EPOCH",&local_1f0);
  if (local_1f0._M_string_length != 0) {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1b0,(string *)&local_1f0,_S_in);
    std::istream::_M_extract<long>(local_1b0);
    if ((*(uint *)((long)auStack_190 + *(long *)(local_1b0[0] + -0x18)) & 7) != 2) {
      cmSystemTools::Error
                ("Cannot parse SOURCE_DATE_EPOCH as integer",(char *)0x0,(char *)0x0,(char *)0x0);
      exit(0x1b);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
    std::ios_base::~ios_base(local_138);
  }
  if (timeT == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pcVar1 = (formatString->_M_dataplus)._M_p;
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d0,pcVar1,pcVar1 + formatString->_M_string_length);
    CreateTimestampFromTimeT(__return_storage_ptr__,this,timeT,&local_1d0,utcFlag);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,
                    CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                             local_1f0.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::CurrentTime(const std::string& formatString,
                                     bool utcFlag)
{
  time_t currentTimeT = time(nullptr);
  std::string source_date_epoch;
  cmSystemTools::GetEnv("SOURCE_DATE_EPOCH", source_date_epoch);
  if (!source_date_epoch.empty()) {
    std::istringstream iss(source_date_epoch);
    iss >> currentTimeT;
    if (iss.fail() || !iss.eof()) {
      cmSystemTools::Error("Cannot parse SOURCE_DATE_EPOCH as integer");
      exit(27);
    }
  }
  if (currentTimeT == time_t(-1)) {
    return std::string();
  }

  return CreateTimestampFromTimeT(currentTimeT, formatString, utcFlag);
}